

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valence_cache.h
# Opt level: O1

void __thiscall
draco::ValenceCache<draco::CornerTable>::ClearValenceCache(ValenceCache<draco::CornerTable> *this)

{
  pointer piVar1;
  pointer piVar2;
  
  piVar1 = (this->vertex_valence_cache_32_bit_).vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish != piVar1) {
    (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = piVar1;
  }
  piVar2 = (this->vertex_valence_cache_32_bit_).vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_valence_cache_32_bit_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    return;
  }
  return;
}

Assistant:

void ClearValenceCache() const {
    vertex_valence_cache_32_bit_.clear();
    // Force erasure.
    IndexTypeVector<VertexIndex, int32_t>().swap(vertex_valence_cache_32_bit_);
  }